

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::UnitTest::UponLeavingGTest(UnitTest *this)

{
  UnitTestImpl *pUVar1;
  OsStackTraceGetterInterface *pOVar2;
  undefined **ppuVar3;
  
  pUVar1 = this->impl_;
  pOVar2 = pUVar1->os_stack_trace_getter_;
  if (pOVar2 == (OsStackTraceGetterInterface *)0x0) {
    pOVar2 = (OsStackTraceGetterInterface *)operator_new(8);
    ppuVar3 = &PTR__OsStackTraceGetterInterface_0014a500;
    pOVar2->_vptr_OsStackTraceGetterInterface =
         (_func_int **)&PTR__OsStackTraceGetterInterface_0014a500;
    pUVar1->os_stack_trace_getter_ = pOVar2;
  }
  else {
    ppuVar3 = pOVar2->_vptr_OsStackTraceGetterInterface;
  }
  (*((_func_int **)ppuVar3)[3])();
  return;
}

Assistant:

void UnitTest::UponLeavingGTest() {
  impl()->os_stack_trace_getter()->UponLeavingGTest();
}